

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_runtime.cpp
# Opt level: O1

void __thiscall MppRuntimeService::MppRuntimeService(MppRuntimeService *this)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  FILE *__stream;
  size_t sVar6;
  FILE *pFVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  bool bVar13;
  RK_S32 val;
  char path [256];
  int local_15c;
  MppRuntimeService *local_158;
  ulong local_150;
  ulong local_148;
  FILE *local_140;
  char local_138 [264];
  
  mpp_env_get_u32("mpp_rt_debug",&mpp_rt_debug,0);
  this->allocator_valid[0] = 1;
  iVar4 = access("/dev/ion",6);
  this->allocator_valid[1] = (uint)(iVar4 == 0);
  iVar4 = access("/dev/dri/renderD128",6);
  if (iVar4 == 0) {
    uVar5 = 1;
  }
  else {
    iVar4 = access("/dev/dri/card0",6);
    uVar5 = (uint)(iVar4 == 0);
  }
  this->allocator_valid[3] = uVar5;
  iVar4 = access("/dev/dma_heap",4);
  this->allocator_valid[4] = (uint)(iVar4 == 0);
  RVar1 = this->allocator_valid[1];
  RVar2 = this->allocator_valid[3];
  if (((iVar4 == 0) || (RVar1 != 0)) || (RVar2 != 0)) {
    if (iVar4 == 0) {
      if (mpp_rt_debug == 0) {
        return;
      }
      pcVar9 = "use dma heap allocator\n";
    }
    else if (RVar1 == 0 || RVar2 != 0) {
      if (RVar2 == 0 || RVar1 != 0) {
        iVar4 = access("/dev/mpp_service",6);
        if (iVar4 != 0) {
          if ((this->allocator_valid[1] != 0) && (this->allocator_valid[3] != 0)) {
            builtin_strncpy(local_138,"/proc/device-tree/",0x13);
            uVar8 = 0;
            uVar10 = 0;
            local_158 = this;
            do {
              local_140 = (FILE *)((long)&_ZL13mpp_vpu_names_rel +
                                  (long)(int)(&_ZL13mpp_vpu_names_rel)[uVar10]);
              piVar12 = &_ZL15mpp_vpu_address_rel;
              uVar11 = 0;
              bVar13 = false;
              bVar3 = false;
              local_150 = uVar8;
              local_148 = uVar10;
              do {
                pFVar7 = local_140;
                uVar5 = snprintf(local_138 + 0x12,0xed,"%s%s",local_140,
                                 (long)&_ZL15mpp_vpu_address_rel + (long)*piVar12);
                iVar4 = access(local_138,0);
                if (iVar4 == 0) {
                  pFVar7 = (FILE *)0x14851c;
                  snprintf(local_138 + 0x12 + uVar5,(ulong)(0xed - uVar5),"/%s");
                  iVar4 = access(local_138,0);
                  if (iVar4 == 0) {
                    local_15c = 0;
                    __stream = fopen(local_138,"rb");
                    if (__stream != (FILE *)0x0) {
                      sVar6 = fread(&local_15c,1,4,__stream);
                      pFVar7 = __stream;
                      if (sVar6 != 4) {
                        pFVar7 = (FILE *)0x0;
                        _mpp_log_l(2,"mpp_rt","failed to read dts allocator value default 0\n",
                                   (char *)0x0);
                        local_15c = 0;
                      }
                      if (local_15c == 0) {
                        local_158->allocator_valid[3] = 0;
                        pcVar9 = "found ion allocator in dts\n";
                      }
                      else {
                        local_158->allocator_valid[1] = 0;
                        pcVar9 = "found drm allocator in dts\n";
                      }
                      if (mpp_rt_debug != 0) {
                        pFVar7 = (FILE *)0x0;
                        _mpp_log_l(4,"mpp_rt",pcVar9,(char *)0x0);
                      }
                      bVar3 = true;
                    }
                  }
                }
                if (bVar3) {
                  if (!bVar13) {
                    if ((local_150 & 1) == 0) {
                      return;
                    }
                    goto LAB_00115f14;
                  }
                  break;
                }
                bVar13 = 5 < uVar11;
                uVar11 = uVar11 + 1;
                piVar12 = piVar12 + 1;
              } while (uVar11 != 7);
              uVar10 = local_148 + 1;
              uVar8 = CONCAT71((int7)((ulong)pFVar7 >> 8),1 < local_148);
            } while (uVar10 != 3);
LAB_00115f14:
            _mpp_log_l(4,"mpp_rt","Can NOT found allocator in dts, enable both ion and drm\n",
                       (char *)0x0);
          }
          return;
        }
        this->allocator_valid[1] = 0;
        if (mpp_rt_debug == 0) {
          return;
        }
        pcVar9 = "use drm allocator for mpp_service\n";
      }
      else {
        if (mpp_rt_debug == 0) {
          return;
        }
        pcVar9 = "use drm allocator\n";
      }
    }
    else {
      if (mpp_rt_debug == 0) {
        return;
      }
      pcVar9 = "use ion allocator\n";
    }
    iVar4 = 4;
  }
  else {
    pcVar9 = "can NOT found any allocator\n";
    iVar4 = 2;
  }
  _mpp_log_l(iVar4,"mpp_rt",pcVar9,(char *)0x0);
  return;
}

Assistant:

MppRuntimeService::MppRuntimeService()
{
    mpp_env_get_u32("mpp_rt_debug", &mpp_rt_debug, 0);

    allocator_valid[MPP_BUFFER_TYPE_NORMAL] = 1;
    allocator_valid[MPP_BUFFER_TYPE_ION] = !access("/dev/ion", F_OK | R_OK | W_OK);
    allocator_valid[MPP_BUFFER_TYPE_DRM] =
        !access("/dev/dri/renderD128", F_OK | R_OK | W_OK) ||
        !access("/dev/dri/card0", F_OK | R_OK | W_OK);
    allocator_valid[MPP_BUFFER_TYPE_DMA_HEAP] = !access("/dev/dma_heap", F_OK | R_OK);

    if (!allocator_valid[MPP_BUFFER_TYPE_ION] &&
        !allocator_valid[MPP_BUFFER_TYPE_DRM] &&
        !allocator_valid[MPP_BUFFER_TYPE_DMA_HEAP]) {
        mpp_err("can NOT found any allocator\n");
        return;
    }

    if (allocator_valid[MPP_BUFFER_TYPE_DMA_HEAP]) {
        mpp_rt_dbg("use dma heap allocator\n");
        return;
    }

    if (allocator_valid[MPP_BUFFER_TYPE_ION] && !allocator_valid[MPP_BUFFER_TYPE_DRM]) {
        mpp_rt_dbg("use ion allocator\n");
        return;
    }

    if (!allocator_valid[MPP_BUFFER_TYPE_ION] && allocator_valid[MPP_BUFFER_TYPE_DRM]) {
        mpp_rt_dbg("use drm allocator\n");
        return;
    }

    if (!access("/dev/mpp_service", F_OK | R_OK | W_OK)) {
        allocator_valid[MPP_BUFFER_TYPE_ION] = 0;

        mpp_rt_dbg("use drm allocator for mpp_service\n");
        return;
    }

    // If both ion and drm is enabled detect allocator in dts to choose one
    // TODO: When unify dma fd kernel is completed this part will be removed.
    if (allocator_valid[MPP_BUFFER_TYPE_ION] &&
        allocator_valid[MPP_BUFFER_TYPE_DRM]) {
        /* Detect hardware buffer type is ion or drm */
        RK_U32 i, j;
        char path[MAX_DTS_PATH_LEN];
        RK_U32 path_len = MAX_DTS_PATH_LEN - 1;
        RK_U32 dts_path_len = snprintf(path, path_len, "%s", mpp_dts_base);
        char *p = path + dts_path_len;
        RK_U32 allocator_found = 0;

        path_len -= dts_path_len;

        for (i = 0; i < MPP_ARRAY_ELEMS(mpp_vpu_names); i++) {
            for (j = 0; j < MPP_ARRAY_ELEMS(mpp_vpu_address); j++) {
                RK_U32 dev_path_len = snprintf(p, path_len, "%s%s",
                                               mpp_vpu_names[i], mpp_vpu_address[j]);
                int f_ok = access(path, F_OK);
                if (f_ok == 0) {
                    snprintf(p + dev_path_len, path_len - dev_path_len, "/%s", "allocator");
                    f_ok = access(path, F_OK);
                    if (f_ok == 0) {
                        RK_S32 val = 0;
                        FILE *fp = fopen(path, "rb");
                        if (fp) {
                            size_t len = fread(&val, 1, 4, fp);
                            // zero for ion non-zero for drm ->
                            // zero     - disable drm
                            // non-zero - disable ion
                            if (len != 4) {
                                mpp_err("failed to read dts allocator value default 0\n");
                                val = 0;
                            }

                            if (val == 0) {
                                allocator_valid[MPP_BUFFER_TYPE_DRM] = 0;
                                mpp_rt_dbg("found ion allocator in dts\n");
                            } else {
                                allocator_valid[MPP_BUFFER_TYPE_ION] = 0;
                                mpp_rt_dbg("found drm allocator in dts\n");
                            }
                            allocator_found = 1;
                        }
                    }
                }
                if (allocator_found)
                    break;
            }
            if (allocator_found)
                break;
        }

        if (!allocator_found)
            mpp_log("Can NOT found allocator in dts, enable both ion and drm\n");
    }
}